

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::cord_internal::CordzInfo::Head::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this)

{
  anon_class_1_0_00000001 *this_local;
  
  __assert_fail("false && \"snapshot.is_snapshot()\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                ,0xe5,
                "auto absl::cord_internal::CordzInfo::Head(const CordzSnapshot &)::(anonymous class)::operator()() const"
               );
}

Assistant:

CordzInfo* CordzInfo::Head(const CordzSnapshot& snapshot) {
  ABSL_ASSERT(snapshot.is_snapshot());

  // We can do an 'unsafe' load of 'head', as we are guaranteed that the
  // instance it points to is kept alive by the provided CordzSnapshot, so we
  // can simply return the current value using an acquire load.
  // We do enforce in DEBUG builds that the 'head' value is present in the
  // delete queue: ODR violations may lead to 'snapshot' and 'global_list_'
  // being in different libraries / modules.
  CordzInfo* head = global_list_.head.load(std::memory_order_acquire);
  ABSL_ASSERT(snapshot.DiagnosticsHandleIsSafeToInspect(head));
  return head;
}